

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapInfo.cpp
# Opt level: O1

void __thiscall Memory::HeapInfo::ShutdownIdleDecommit(HeapInfo *this)

{
  IdleDecommitPageAllocator::ShutdownIdleDecommit
            (&(this->recyclerPageAllocator).super_IdleDecommitPageAllocator);
  IdleDecommitPageAllocator::ShutdownIdleDecommit
            (&(this->recyclerLargeBlockPageAllocator).super_IdleDecommitPageAllocator);
  IdleDecommitPageAllocator::ShutdownIdleDecommit
            (&(this->recyclerWithBarrierPageAllocator).super_IdleDecommitPageAllocator);
  IdleDecommitPageAllocator::ShutdownIdleDecommit(this->recyclerLeafPageAllocator);
  return;
}

Assistant:

void
HeapInfo::ShutdownIdleDecommit()
{
    ForEachPageAllocator([](IdleDecommitPageAllocator * pageAlloc)
    {
        pageAlloc->ShutdownIdleDecommit();
    });
}